

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall
duckdb::ART::Erase(ART *this,Node *node,reference<const_ARTKey> key,idx_t depth,
                  reference<const_ARTKey> row_id,GateStatus status)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  optional_idx oVar4;
  unsafe_optional_ptr<Node> node_00;
  uint8_t byte;
  IndexPointer child;
  ulong uVar5;
  reference<Node> next;
  reference<Node> ref;
  idx_t temp_depth;
  idx_t local_60;
  reference<duckdb::Node> local_58;
  reference<const_ARTKey> local_50;
  reference<const_ARTKey> local_48;
  reference<duckdb::Node> local_40;
  idx_t local_38;
  
  uVar1 = (node->super_IndexPointer).data;
  if (uVar1 >> 0x38 == 0) {
    return;
  }
  local_60 = depth;
  local_58._M_data = node;
  local_48._M_data = row_id._M_data;
  if (((uVar1 & 0x7f00000000000000) == 0x100000000000000) &&
     (oVar4 = TraverseInternal<duckdb::Node>(this,&local_58,key._M_data,&local_60,true),
     oVar4.index != 0xffffffffffffffff)) {
    return;
  }
  uVar1 = ((local_58._M_data)->super_IndexPointer).data;
  bVar2 = (byte)(uVar1 >> 0x38);
  if ((bVar2 & 0x7f) == 2) {
    Leaf::TransformToNested(this,local_58._M_data);
  }
  else if ((bVar2 & 0x7f) == 7) {
    uVar5 = *(ulong *)(local_48._M_data)->data ^ 0x80;
    if ((uVar1 & 0xffffffffffffff) !=
        (*(ulong *)(local_48._M_data)->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
         (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8
         | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38)) {
      return;
    }
    Node::Free(this,node);
    return;
  }
  if ((status == GATE_NOT_SET) && ((long)((local_58._M_data)->super_IndexPointer).data < 0)) {
    Erase(this,local_58._M_data,local_48,0,local_48,GATE_SET);
    return;
  }
  if ((byte)((*(byte *)((long)&((local_58._M_data)->super_IndexPointer).data + 7) & 0x7f) - 8) < 3)
  {
    local_38 = CONCAT71(local_38._1_7_,(key._M_data)->data[local_60]);
    bVar3 = Node::HasByte(local_58._M_data,this,(uint8_t *)&local_38);
    if (!bVar3) {
      return;
    }
    byte = (key._M_data)->data[local_60];
  }
  else {
    local_50._M_data = key._M_data;
    node_00 = GetChildInternal<duckdb::Node_const>
                        (this,local_58._M_data,(key._M_data)->data[local_60]);
    if (node_00.ptr == (Node *)0x0) {
      return;
    }
    if ((((node_00.ptr)->super_IndexPointer).data & 0x7f00000000000000) == 0x200000000000000) {
      Leaf::TransformToNested(this,node_00.ptr);
    }
    if ((status == GATE_NOT_SET) && ((long)((node_00.ptr)->super_IndexPointer).data < 0)) {
      Erase(this,node_00.ptr,local_48,0,local_48,GATE_SET);
      child.data = ((node_00.ptr)->super_IndexPointer).data;
      byte = (local_50._M_data)->data[local_60];
      if (0xffffffffffffff < child.data) {
LAB_00c2945f:
        Node::ReplaceChild(local_58._M_data,this,byte,(Node)child.data);
        return;
      }
      status = GATE_NOT_SET;
      key._M_data = local_50._M_data;
    }
    else {
      local_38 = local_60 + 1;
      local_40._M_data = (Node *)node_00;
      if (((((node_00.ptr)->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) &&
         (oVar4 = TraverseInternal<duckdb::Node>(this,&local_40,local_50._M_data,&local_38,true),
         oVar4.index != 0xffffffffffffffff)) {
        return;
      }
      uVar1 = ((local_40._M_data)->super_IndexPointer).data;
      if ((uVar1 & 0x7f00000000000000) == 0x700000000000000) {
        uVar5 = *(ulong *)(local_48._M_data)->data ^ 0x80;
        if ((uVar1 & 0xffffffffffffff) !=
            (*(ulong *)(local_48._M_data)->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
             (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
             (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
            uVar5 << 0x38)) {
          return;
        }
        byte = (local_50._M_data)->data[local_60];
        key._M_data = local_50._M_data;
      }
      else {
        Erase(this,node_00.ptr,local_50,local_60 + 1,local_48,status);
        child.data = ((node_00.ptr)->super_IndexPointer).data;
        byte = (local_50._M_data)->data[local_60];
        key._M_data = local_50._M_data;
        if (0xffffffffffffff < child.data) goto LAB_00c2945f;
      }
    }
  }
  Node::DeleteChild(this,local_58._M_data,node,byte,status,key._M_data);
  return;
}

Assistant:

void ART::Erase(Node &node, reference<const ARTKey> key, idx_t depth, reference<const ARTKey> row_id,
                GateStatus status) {
	if (!node.HasMetadata()) {
		return;
	}

	// Traverse the prefix.
	reference<Node> next(node);
	if (next.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, next, key, depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	//	Delete the row ID from the leaf.
	//	This is the root node, which can be a leaf with possible prefix nodes.
	if (next.get().GetType() == NType::LEAF_INLINED) {
		if (next.get().GetRowId() == row_id.get().GetRowId()) {
			Node::Free(*this, node);
		}
		return;
	}

	// Transform a deprecated leaf.
	if (next.get().GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, next);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && next.get().GetGateStatus() == GateStatus::GATE_SET) {
		return Erase(next, row_id, 0, row_id, GateStatus::GATE_SET);
	}

	D_ASSERT(depth < key.get().len);
	if (next.get().IsLeafNode()) {
		auto byte = key.get()[depth];
		if (next.get().HasByte(*this, byte)) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	auto child = next.get().GetChildMutable(*this, key.get()[depth]);
	if (!child) {
		// No child at the byte: nothing to erase.
		return;
	}

	// Transform a deprecated leaf.
	if (child->GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, *child);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && child->GetGateStatus() == GateStatus::GATE_SET) {
		Erase(*child, row_id, 0, row_id, GateStatus::GATE_SET);
		if (!child->HasMetadata()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		} else {
			next.get().ReplaceChild(*this, key.get()[depth], *child);
		}
		return;
	}

	auto temp_depth = depth + 1;
	reference<Node> ref(*child);

	if (ref.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, ref, key, temp_depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	if (ref.get().GetType() == NType::LEAF_INLINED) {
		if (ref.get().GetRowId() == row_id.get().GetRowId()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	// Recurse.
	Erase(*child, key, depth + 1, row_id, status);
	if (!child->HasMetadata()) {
		Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
	} else {
		next.get().ReplaceChild(*this, key.get()[depth], *child);
	}
}